

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

TValue * get_equalTM(lua_State *L,Table *mt1,Table *mt2,TMS event)

{
  int iVar1;
  TValue *t1;
  TValue *t2;
  
  if (((mt1 != (Table *)0x0) && ((mt1->flags & 0x20) == 0)) &&
     (t1 = luaT_gettm(mt1,TM_EQ,L->l_G->tmname[5]), t1 != (TValue *)0x0)) {
    if (mt1 == mt2) {
      return t1;
    }
    if (((mt2 != (Table *)0x0) && ((mt2->flags & 0x20) == 0)) &&
       ((t2 = luaT_gettm(mt2,TM_EQ,L->l_G->tmname[5]), t2 != (TValue *)0x0 &&
        ((t1->tt_ == t2->tt_ && (iVar1 = luaV_equalobj_((lua_State *)0x0,t1,t2), iVar1 != 0)))))) {
      return t1;
    }
  }
  return (TValue *)0x0;
}

Assistant:

static const TValue *get_equalTM (lua_State *L, Table *mt1, Table *mt2,
                                  TMS event) {
  const TValue *tm1 = fasttm(L, mt1, event);
  const TValue *tm2;
  if (tm1 == NULL) return NULL;  /* no metamethod */
  if (mt1 == mt2) return tm1;  /* same metatables => same metamethods */
  tm2 = fasttm(L, mt2, event);
  if (tm2 == NULL) return NULL;  /* no metamethod */
  if (luaV_rawequalobj(tm1, tm2))  /* same metamethods? */
    return tm1;
  return NULL;
}